

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::TypeParameterSymbol::serializeTo(TypeParameterSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  Type *__n;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  DeclaredType *unaff_retaddr;
  char *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff98);
  __n = DeclaredType::getType(unaff_retaddr);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff98);
  bVar1 = ParameterSymbolBase::isLocalParam((ParameterSymbolBase *)(in_RDI + 4));
  ASTSerializer::write(in_RSI,local_30,local_28,(ulong)bVar1);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  bVar1 = ParameterSymbolBase::isPortParam((ParameterSymbolBase *)(in_RDI + 4));
  ASTSerializer::write(this_00,local_40,local_38,(ulong)bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)this_00);
  bVar1 = ParameterSymbolBase::isBodyParam((ParameterSymbolBase *)0x9476f5);
  ASTSerializer::write(in_RSI,local_50,local_48,(ulong)bVar1);
  return;
}

Assistant:

void TypeParameterSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("type", targetType.getType());
    serializer.write("isLocal", isLocalParam());
    serializer.write("isPort", isPortParam());
    serializer.write("isBody", isBodyParam());
}